

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O0

int bip39_mnemonic_to_bytes(words *w,char *mnemonic,uchar *bytes_out,size_t len,size_t *written)

{
  ulong uVar1;
  _Bool _Var2;
  words *local_88;
  int local_7c;
  size_t sStack_78;
  int ret;
  size_t tmp_len;
  size_t mask;
  uchar tmp_bytes [42];
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  char *mnemonic_local;
  words *w_local;
  
  local_88 = w;
  if (w == (words *)0x0) {
    local_88 = &en_words;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((local_88->bits == 0xb) && (mnemonic != (char *)0x0)) && (bytes_out != (uchar *)0x0)) {
    unique0x10000117 = written;
    local_7c = mnemonic_to_bytes(local_88,mnemonic,(uchar *)&mask,0x2a,&stack0xffffffffffffff88);
    if (local_7c == 0) {
      uVar1 = sStack_78 - 1;
      if (0x20 < sStack_78 - 1) {
        uVar1 = sStack_78 - 2;
      }
      sStack_78 = uVar1;
      if (sStack_78 < 0x2b) {
        if (sStack_78 <= len) {
          tmp_len = len_to_mask(sStack_78);
          if ((tmp_len == 0) || (_Var2 = checksum_ok((uchar *)&mask,sStack_78,tmp_len), !_Var2)) {
            sStack_78 = 0;
            local_7c = -2;
          }
          else {
            memcpy(bytes_out,&mask,sStack_78);
          }
        }
      }
      else {
        local_7c = -2;
      }
    }
    wally_clear(&mask,0x2a);
    if ((local_7c == 0) && (stack0xffffffffffffffc8 != (size_t *)0x0)) {
      *stack0xffffffffffffffc8 = sStack_78;
    }
    w_local._4_4_ = local_7c;
  }
  else {
    w_local._4_4_ = -2;
  }
  return w_local._4_4_;
}

Assistant:

int bip39_mnemonic_to_bytes(const struct words *w, const char *mnemonic,
                            unsigned char *bytes_out, size_t len,
                            size_t *written)
{
    unsigned char tmp_bytes[BIP39_ENTROPY_LEN_MAX];
    size_t mask, tmp_len;
    int ret;

    /* Ideally we would infer the wordlist here. Unfortunately this cannot
     * work reliably because the default word lists overlap. In combination
     * with being sorted lexographically, this means the default lists
     * were poorly chosen. But we are stuck with them now.
     *
     * If the caller doesn't know which word list to use, they should iterate
     * over the available ones and try any resulting list that the mnemonic
     * validates against.
     */
    w = w ? w : &en_words;

    if (written)
        *written = 0;

    if (w->bits != 11u || !mnemonic || !bytes_out)
        return WALLY_EINVAL;

    ret = mnemonic_to_bytes(w, mnemonic, tmp_bytes, sizeof(tmp_bytes), &tmp_len);

    if (!ret) {
        /* Remove checksum bytes from the output length */
        --tmp_len;
        if (tmp_len > BIP39_ENTROPY_LEN_256)
            --tmp_len; /* Second byte required */

        if (tmp_len > sizeof(tmp_bytes))
            ret = WALLY_EINVAL; /* Too big for biggest supported entropy */
        else {
            if (tmp_len <= len) {
                if (!(mask = len_to_mask(tmp_len)) ||
                    !checksum_ok(tmp_bytes, tmp_len, mask)) {
                    tmp_len = 0;
                    ret = WALLY_EINVAL; /* Bad checksum */
                }
                else
                    memcpy(bytes_out, tmp_bytes, tmp_len);
            }
        }
    }

    wally_clear(tmp_bytes, sizeof(tmp_bytes));
    if (!ret && written)
        *written = tmp_len;
    return ret;
}